

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::LocalClient::whenMoreResolved(LocalClient *this)

{
  undefined1 node [8];
  ClientHook *pCVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_02;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar2;
  void *continuationTracePtr;
  undefined1 local_48 [8];
  PromiseArena *local_40;
  Own<capnp::ClientHook,_std::nullptr_t> local_38;
  anon_class_8_1_8991fb9c_for_func local_28;
  Event **local_20;
  
  if (*(long *)(in_RSI + 0x60) == 0) {
    if (*(char *)(in_RSI + 0x40) == '\x01') {
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_48);
      local_40 = (PromiseArena *)
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:672:33)>
                 ::anon_class_8_1_8991fb9c_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::LocalClient::whenMoreResolved()::_lambda()_1_>,kj::_::PromiseDisposer,capnp::LocalClient::whenMoreResolved()::_lambda()_1_,void*&>
                ((PromiseDisposer *)&local_20,(OwnPromiseNode *)local_48,&local_28,&local_40);
      node = local_48;
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      (this->super_ClientHook).brand = local_20;
      in_RDX = extraout_RDX_01;
      if (local_48 != (undefined1  [8])0x0) {
        local_48 = (undefined1  [8])0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
        in_RDX = extraout_RDX_02;
      }
    }
    else {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
    }
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x60) + 0x20))(&local_38);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              ((PromiseDisposer *)&local_40,&local_38);
    pCVar1 = local_38.ptr;
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = local_40;
    in_RDX = extraout_RDX;
    if ((EventLoop *)local_38.ptr != (EventLoop *)0x0) {
      local_38.ptr = (ClientHook *)0x0;
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 (long)&((Maybe<kj::EventPort_&> *)&pCVar1->_vptr_ClientHook)->ptr +
                 (long)((Maybe<kj::EventPort_&> *)&pCVar1->_vptr_ClientHook)->ptr[-2].
                       _vptr_EventPort);
      in_RDX = extraout_RDX_00;
    }
  }
  MVar2.ptr.field_1 = in_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->addRef());
    } else KJ_IF_SOME(t, resolveTask) {
      return t.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(resolved)->addRef();
      });
    } else {
      return kj::none;
    }